

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O1

bool Assimp::BaseImporter::CheckMagicToken
               (IOSystem *pIOHandler,string *pFile,void *_magic,uint num,uint offset,uint size)

{
  ushort uVar1;
  uint uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar7;
  ulong __n;
  bool bVar8;
  anon_union_16_3_a3d9a762 anon_var_0;
  long *local_50 [2];
  long local_40 [2];
  long *plVar6;
  
  if (0x10 < size) {
    __assert_fail("size <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/BaseImporter.cpp"
                  ,299,
                  "static bool Assimp::BaseImporter::CheckMagicToken(IOSystem *, const std::string &, const void *, unsigned int, unsigned int, unsigned int)"
                 );
  }
  if (_magic == (void *)0x0) {
    __assert_fail("_magic",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/BaseImporter.cpp"
                  ,300,
                  "static bool Assimp::BaseImporter::CheckMagicToken(IOSystem *, const std::string &, const void *, unsigned int, unsigned int, unsigned int)"
                 );
  }
  if (pIOHandler == (IOSystem *)0x0) {
    bVar8 = false;
  }
  else {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"rb","");
    iVar5 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_50[0]);
    plVar6 = (long *)CONCAT44(extraout_var,iVar5);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 0x20))(plVar6,offset,0);
      __n = (ulong)size;
      uVar7 = (**(code **)(*plVar6 + 0x10))(plVar6,local_50,1,__n);
      bVar8 = uVar7 == __n;
      if ((bVar8) && (num != 0)) {
        uVar4 = (uint)local_50[0];
        uVar3 = (ushort)local_50[0];
        do {
          if (size == 4) {
            uVar2 = *_magic;
            if ((uVar4 == uVar2) ||
               (uVar4 == (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                         uVar2 << 0x18))) goto LAB_003c6496;
          }
          else if (size == 2) {
            uVar1 = (ushort)*_magic;
            if ((uVar3 == uVar1) || (uVar3 == (ushort)(uVar1 << 8 | uVar1 >> 8))) goto LAB_003c6496;
          }
          else {
            iVar5 = bcmp(_magic,local_50,__n);
            if (iVar5 == 0) goto LAB_003c6496;
          }
          _magic = (void *)((long)_magic + __n);
          num = num - 1;
        } while (num != 0);
      }
    }
    bVar8 = false;
LAB_003c6496:
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 8))(plVar6);
    }
  }
  return bVar8;
}

Assistant:

bool BaseImporter::CheckMagicToken(IOSystem* pIOHandler, const std::string& pFile,
    const void* _magic, unsigned int num, unsigned int offset, unsigned int size)
{
    ai_assert( size <= 16 );
    ai_assert( _magic );

    if (!pIOHandler) {
        return false;
    }
    union {
        const char* magic;
        const uint16_t* magic_u16;
        const uint32_t* magic_u32;
    };
    magic = reinterpret_cast<const char*>(_magic);
    std::unique_ptr<IOStream> pStream (pIOHandler->Open(pFile));
    if (pStream.get() ) {

        // skip to offset
        pStream->Seek(offset,aiOrigin_SET);

        // read 'size' characters from the file
        union {
            char data[16];
            uint16_t data_u16[8];
            uint32_t data_u32[4];
        };
        if(size != pStream->Read(data,1,size)) {
            return false;
        }

        for (unsigned int i = 0; i < num; ++i) {
            // also check against big endian versions of tokens with size 2,4
            // that's just for convenience, the chance that we cause conflicts
            // is quite low and it can save some lines and prevent nasty bugs
            if (2 == size) {
                uint16_t rev = *magic_u16;
                ByteSwap::Swap(&rev);
                if (data_u16[0] == *magic_u16 || data_u16[0] == rev) {
                    return true;
                }
            }
            else if (4 == size) {
                uint32_t rev = *magic_u32;
                ByteSwap::Swap(&rev);
                if (data_u32[0] == *magic_u32 || data_u32[0] == rev) {
                    return true;
                }
            }
            else {
                // any length ... just compare
                if(!memcmp(magic,data,size)) {
                    return true;
                }
            }
            magic += size;
        }
    }
    return false;
}